

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidGetValidElements(xmlNode *prev,xmlNode *next,xmlChar **names,int max)

{
  xmlNodePtr elem;
  xmlDtdPtr dtd;
  int iVar1;
  xmlNodePtr cur;
  _xmlNode **pp_Var2;
  uint uVar3;
  xmlNode *pxVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  int nb_elements;
  xmlValidCtxt vctxt;
  xmlChar *elements [256];
  int local_904;
  _xmlNode *local_900;
  int local_8f4;
  _xmlNode *local_8f0;
  _xmlNode *local_8e8;
  xmlNode *local_8e0;
  xmlChar *local_8d8;
  _xmlNode **local_8d0;
  xmlElementPtr local_8c8;
  xmlNodePtr local_8c0;
  _xmlNode *local_8b8;
  _xmlNode *p_Stack_8b0;
  xmlValidCtxt local_8a8;
  xmlChar *local_838 [257];
  
  memset(local_838,0,0x800);
  local_904 = 0;
  uVar5 = 0xffffffff;
  if (0 < max && (names != (xmlChar **)0x0 && (prev != (xmlNode *)0x0 || next != (xmlNode *)0x0))) {
    local_8a8.userData = (void *)0x0;
    local_8a8.am = (xmlAutomataPtr)0x0;
    local_8a8.state = (xmlAutomataStatePtr)0x0;
    local_8a8.vstateNr = 0;
    local_8a8.vstateMax = 0;
    local_8a8.vstateTab = (xmlValidState *)0x0;
    local_8a8.valid = 0;
    local_8a8._68_4_ = 0;
    local_8a8.vstate = (xmlValidState *)0x0;
    local_8a8.flags = 0;
    local_8a8._52_4_ = 0;
    local_8a8.doc = (xmlDocPtr)0x0;
    local_8a8.nodeNr = 0;
    local_8a8.nodeMax = 0;
    local_8a8.nodeTab = (xmlNodePtr *)0x0;
    local_8a8.warning = (xmlValidityWarningFunc)0x0;
    local_8a8.node = (xmlNodePtr)0x0;
    local_8a8.error = xmlNoValidityErr;
    pxVar4 = prev;
    if (prev == (xmlNode *)0x0) {
      pxVar4 = next;
    }
    elem = pxVar4->parent;
    local_900 = next;
    local_8f4 = max;
    local_8c8 = xmlGetDtdElementDesc(elem->doc->intSubset,elem->name);
    if ((local_8c8 != (xmlElementPtr)0x0) ||
       ((dtd = elem->doc->extSubset, dtd != (xmlDtdPtr)0x0 &&
        (local_8c8 = xmlGetDtdElementDesc(dtd,elem->name), local_8c8 != (xmlElementPtr)0x0)))) {
      if (prev == (xmlNode *)0x0) {
        local_8e8 = (_xmlNode *)0x0;
      }
      else {
        local_8e8 = prev->next;
      }
      if (local_900 == (_xmlNode *)0x0) {
        local_8f0 = (_xmlNode *)0x0;
      }
      else {
        local_8f0 = local_900->prev;
      }
      local_8b8 = elem->children;
      p_Stack_8b0 = elem->last;
      uVar3 = 0;
      cur = xmlNewDocNode(pxVar4->doc,(xmlNsPtr)0x0,(xmlChar *)"<!dummy?>",(xmlChar *)0x0);
      if (cur != (xmlNodePtr)0x0) {
        local_8d0 = &elem->children;
        pp_Var2 = &prev->next;
        if (prev == (xmlNode *)0x0) {
          pp_Var2 = local_8d0;
        }
        cur->parent = elem;
        cur->prev = prev;
        cur->next = local_900;
        local_8d8 = cur->name;
        *pp_Var2 = cur;
        pp_Var2 = &local_900->prev;
        if (local_900 == (_xmlNode *)0x0) {
          pp_Var2 = &elem->last;
        }
        *pp_Var2 = cur;
        local_904 = xmlValidGetPotentialChildren(local_8c8->content,local_838,&local_904,0x100);
        if (0 < local_904) {
          lVar6 = 0;
          uVar3 = 0;
          local_8e0 = prev;
          local_8c0 = cur;
          do {
            cur->name = local_838[lVar6];
            iVar1 = xmlValidateOneElement(&local_8a8,elem->doc,elem);
            if (iVar1 != 0) {
              if ((int)uVar3 < 1) {
                uVar8 = (ulong)(int)uVar3;
              }
              else {
                uVar8 = (ulong)uVar3;
                uVar7 = 1;
                do {
                  iVar1 = xmlStrEqual(local_838[lVar6],names[uVar7 - 1]);
                  prev = local_8e0;
                  if (iVar1 != 0) break;
                  bVar9 = uVar7 < uVar8;
                  uVar7 = uVar7 + 1;
                } while (bVar9);
              }
              uVar3 = uVar3 + 1;
              names[uVar8] = local_838[lVar6];
              cur = local_8c0;
              if (local_8f4 <= (int)uVar3) break;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < local_904);
        }
        if (prev != (xmlNode *)0x0) {
          prev->next = local_8e8;
        }
        if (local_900 != (_xmlNode *)0x0) {
          local_900->prev = local_8f0;
        }
        *local_8d0 = local_8b8;
        local_8d0[1] = p_Stack_8b0;
        cur->name = local_8d8;
        xmlFreeNode(cur);
        uVar5 = uVar3;
      }
    }
  }
  return uVar5;
}

Assistant:

int
xmlValidGetValidElements(xmlNode *prev, xmlNode *next, const xmlChar **names,
                         int max) {
    xmlValidCtxt vctxt;
    int nb_valid_elements = 0;
    const xmlChar *elements[256]={0};
    int nb_elements = 0, i;
    const xmlChar *name;

    xmlNode *ref_node;
    xmlNode *parent;
    xmlNode *test_node;

    xmlNode *prev_next;
    xmlNode *next_prev;
    xmlNode *parent_childs;
    xmlNode *parent_last;

    xmlElement *element_desc;

    if (prev == NULL && next == NULL)
        return(-1);

    if (names == NULL) return(-1);
    if (max <= 0) return(-1);

    memset(&vctxt, 0, sizeof (xmlValidCtxt));
    vctxt.error = xmlNoValidityErr;	/* this suppresses err/warn output */

    nb_valid_elements = 0;
    ref_node = prev ? prev : next;
    parent = ref_node->parent;

    /*
     * Retrieves the parent element declaration
     */
    element_desc = xmlGetDtdElementDesc(parent->doc->intSubset,
                                         parent->name);
    if ((element_desc == NULL) && (parent->doc->extSubset != NULL))
        element_desc = xmlGetDtdElementDesc(parent->doc->extSubset,
                                             parent->name);
    if (element_desc == NULL) return(-1);

    /*
     * Do a backup of the current tree structure
     */
    prev_next = prev ? prev->next : NULL;
    next_prev = next ? next->prev : NULL;
    parent_childs = parent->children;
    parent_last = parent->last;

    /*
     * Creates a dummy node and insert it into the tree
     */
    test_node = xmlNewDocNode (ref_node->doc, NULL, BAD_CAST "<!dummy?>", NULL);
    if (test_node == NULL)
        return(-1);

    test_node->parent = parent;
    test_node->prev = prev;
    test_node->next = next;
    name = test_node->name;

    if (prev) prev->next = test_node;
    else parent->children = test_node;

    if (next) next->prev = test_node;
    else parent->last = test_node;

    /*
     * Insert each potential child node and check if the parent is
     * still valid
     */
    nb_elements = xmlValidGetPotentialChildren(element_desc->content,
		       elements, &nb_elements, 256);

    for (i = 0;i < nb_elements;i++) {
	test_node->name = elements[i];
	if (xmlValidateOneElement(&vctxt, parent->doc, parent)) {
	    int j;

	    for (j = 0; j < nb_valid_elements;j++)
		if (xmlStrEqual(elements[i], names[j])) break;
	    names[nb_valid_elements++] = elements[i];
	    if (nb_valid_elements >= max) break;
	}
    }

    /*
     * Restore the tree structure
     */
    if (prev) prev->next = prev_next;
    if (next) next->prev = next_prev;
    parent->children = parent_childs;
    parent->last = parent_last;

    /*
     * Free up the dummy node
     */
    test_node->name = name;
    xmlFreeNode(test_node);

    return(nb_valid_elements);
}